

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

mat4 * projection(mat4 *__return_storage_ptr__,double coeff)

{
  mat<4UL,_4UL>::identity();
  __return_storage_ptr__->rows[3].data[2] = coeff;
  return __return_storage_ptr__;
}

Assistant:

mat4 projection(double coeff)
{
    mat4 Projection = mat4::identity();
    Projection[3][2] = coeff;
    return Projection;
}